

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O3

void __thiscall t_lua_generator::generate_service(t_lua_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  ostream *poVar4;
  undefined4 extraout_var_00;
  size_type *psVar5;
  long *plVar6;
  t_program *program;
  t_program *program_00;
  ofstream_with_content_based_conditional_update *poVar7;
  t_lua_generator *this_01;
  string f_service_name;
  string cur_ns;
  string outdir;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_50,this);
  get_namespace_abi_cxx11_
            (&local_70,(t_lua_generator *)(this->super_t_oop_generator).super_t_generator.program_,
             program);
  std::operator+(&local_b0,&local_50,&local_70);
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,*(ulong *)CONCAT44(extraout_var,iVar2));
  paVar1 = &local_d0.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_90 = &local_80;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar3[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_d0,(char *)local_90,(allocator *)&local_b0);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_service_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this->f_service_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_service_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_d0,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  lua_includes_abi_cxx11_(&local_b0,this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (this->gen_requires_ == true) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"require \'",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ttypes\'",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (tservice->extends_ != (t_service *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"require \'",9);
      get_namespace_abi_cxx11_
                (&local_d0,(t_lua_generator *)(tservice->extends_->super_t_type).program_,program_00
                );
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_00,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      iVar2 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)CONCAT44(extraout_var_00,iVar2),
                          ((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  this_01 = this;
  generate_service_client(this,(ostream *)this_00,tservice);
  generate_service_interface(this_01,(ostream *)this_00,tservice);
  generate_service_processor(this,(ostream *)this_00,tservice);
  poVar7 = this_00;
  generate_service_helpers(this,(ostream *)this_00,tservice);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,(int)poVar7);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_lua_generator::generate_service(t_service* tservice) {
  // Get output directory
  string outdir = get_out_dir();

  // Open the file for writing
  string cur_ns = get_namespace(program_);
  string f_service_name = outdir + cur_ns + tservice->get_name() + ".lua";
  f_service_.open(f_service_name.c_str());

  // Headers
  f_service_ << autogen_comment() << lua_includes();
  if (gen_requires_) {
    f_service_ << endl << "require '" << cur_ns << "ttypes'" << endl;

    if (tservice->get_extends() != nullptr) {
      f_service_ << "require '" << get_namespace(tservice->get_extends()->get_program())
                 << tservice->get_extends()->get_name() << "'" << endl;
    }
  }

  f_service_ << endl;

  generate_service_client(f_service_, tservice);
  generate_service_interface(f_service_, tservice);
  generate_service_processor(f_service_, tservice);
  generate_service_helpers(f_service_, tservice);

  // Close the file
  f_service_.close();
}